

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

int get_var(char *data,size_t data_len,char *name,char *dst,size_t dst_len)

{
  int iVar1;
  uint uVar2;
  size_t len;
  char *pcVar3;
  char *pcVar4;
  char *src;
  long lVar5;
  
  if (dst_len == 0 || dst == (char *)0x0) {
    iVar1 = -2;
  }
  else {
    if (((data_len == 0) || (data == (char *)0x0)) || (name == (char *)0x0)) {
      *dst = '\0';
    }
    else {
      len = strlen(name);
      *dst = '\0';
      for (lVar5 = 0; data + lVar5 + len < data + data_len; lVar5 = lVar5 + 1) {
        if (((lVar5 == 0) || (data[lVar5 + -1] == '&')) &&
           ((data[lVar5 + len] == '=' && (iVar1 = mg_strncasecmp(name,data + lVar5,len), iVar1 == 0)
            ))) {
          src = data + lVar5 + len + 1;
          pcVar3 = (char *)memchr(src,0x26,(~len + data_len) - lVar5);
          pcVar4 = data + data_len;
          if (pcVar3 != (char *)0x0) {
            pcVar4 = pcVar3;
          }
          if (src <= pcVar4) {
            uVar2 = mg_url_decode(src,((int)pcVar4 + ~((int)data + (int)len)) - (int)lVar5,dst,
                                  (int)dst_len,1);
            if (uVar2 < 0xfffffffe) {
              return uVar2;
            }
            return -2;
          }
          __assert_fail("s >= p",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ProjetoHotSpot[P]UaiFai/lib/mongoose.c"
                        ,0x12f5,"int get_var(const char *, size_t, const char *, char *, size_t)");
        }
      }
    }
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

static int get_var(const char *data, size_t data_len, const char *name,
                   char *dst, size_t dst_len) {
  const char *p, *e, *s;
  size_t name_len;
  int len;

  if (dst == NULL || dst_len == 0) {
    len = -2;
  } else if (data == NULL || name == NULL || data_len == 0) {
    len = -1;
    dst[0] = '\0';
  } else {
    name_len = strlen(name);
    e = data + data_len;
    len = -1;
    dst[0] = '\0';

    // data is "var1=val1&var2=val2...". Find variable first
    for (p = data; p + name_len < e; p++) {
      if ((p == data || p[-1] == '&') && p[name_len] == '=' &&
          !mg_strncasecmp(name, p, name_len)) {

        // Point p to variable value
        p += name_len + 1;

        // Point s to the end of the value
        s = (const char *) memchr(p, '&', (size_t)(e - p));
        if (s == NULL) {
          s = e;
        }
        assert(s >= p);

        // Decode variable into destination buffer
        len = mg_url_decode(p, (size_t)(s - p), dst, dst_len, 1);

        // Redirect error code from -1 to -2 (destination buffer too small).
        if (len == -1) {
          len = -2;
        }
        break;
      }
    }
  }

  return len;
}